

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O1

void CompiledMixedType<int,unsigned_long_long>(void)

{
  int32_t a;
  int iVar1;
  uint32_t tmp_4;
  int iVar2;
  int32_t tmp;
  uint64_t u1;
  int ret_1;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_38;
  int32_t local_34;
  uint64_t local_30;
  int local_24;
  
  local_38.m_int = 0;
  local_30 = 0;
  local_34 = 0;
  LargeIntRegMultiply<int,_unsigned_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(0,&local_30,&local_34);
  local_30 = 0;
  local_34 = 0;
  LargeIntRegMultiply<int,_unsigned_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (local_38.m_int,&local_30,&local_34);
  local_30 = 0;
  local_34 = 0;
  LargeIntRegMultiply<int,_unsigned_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (local_38.m_int,&local_30,&local_34);
  a = local_34;
  local_38.m_int = local_34;
  local_30 = 0;
  local_34 = 0;
  LargeIntRegMultiply<int,_unsigned_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(a,&local_30,&local_34);
  local_38.m_int = 1;
  local_30 = local_30 & 0xffffffff00000000;
  local_34 = 1;
  DivisionHelper<int,_int,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,&local_34,(int *)&local_30);
  operator/(1,local_38);
  if (local_38.m_int == 0) {
    local_38.m_int = 0;
  }
  if (local_38.m_int == 0) {
    local_38.m_int = 0;
  }
  if ((((long)local_38.m_int != 0x7fffffff) &&
      (0xfffffffeffffffff < (long)local_38.m_int - 0x7fffffffU)) &&
     (iVar2 = local_38.m_int + 1, iVar1 = local_38.m_int + 2, local_38.m_int = iVar2, iVar2 <= iVar1
     )) {
    local_38.m_int = 0;
    local_34 = 0;
    local_30 = 0;
    local_24 = 0;
    SubtractionHelper<unsigned_long_long,_int,_15>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (&local_30,&local_34,&local_24);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}